

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LicenseAccess.cpp
# Opt level: O1

int __thiscall
bhf::ads::TcLicenseOnlineInfo::ShowOrderNo(TcLicenseOnlineInfo *this,ostream *os,AdsDevice *device)

{
  char *__s;
  long lVar1;
  ostream *poVar2;
  size_t sVar3;
  value_type *__val;
  uint uVar4;
  char *pcVar5;
  uint32_t bytesRead;
  string local_1d8;
  stringstream stream;
  long local_1a8 [3];
  uint auStack_190 [22];
  ios_base local_138 [264];
  
  bytesRead = 0;
  __s = (char *)operator_new(0x10);
  __s[0] = '\0';
  __s[1] = '\0';
  __s[2] = '\0';
  __s[3] = '\0';
  __s[4] = '\0';
  __s[5] = '\0';
  __s[6] = '\0';
  __s[7] = '\0';
  __s[8] = '\0';
  __s[9] = '\0';
  __s[10] = '\0';
  __s[0xb] = '\0';
  __s[0xc] = '\0';
  __s[0xd] = '\0';
  __s[0xe] = '\0';
  __s[0xf] = '\0';
  lVar1 = AdsDevice::ReadWriteReqEx2(device,0x101000d,0,0x10,__s,0x10,this,&bytesRead);
  if (lVar1 == 0) {
    if (bytesRead < 2) {
      sVar3 = 3;
      pcVar5 = "N/A";
    }
    else {
      __s[0xf] = '\0';
      sVar3 = strlen(__s);
      pcVar5 = __s;
    }
    std::__ostream_insert<char,std::char_traits<char>>(os,pcVar5,sVar3);
    uVar4 = (uint)(*(int *)(os + *(long *)(*(long *)os + -0x18) + 0x20) != 0);
  }
  else {
    std::__cxx11::stringstream::stringstream((stringstream *)&stream);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"ShowOrderNo",0xb);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"(): failed with: 0x",0x13);
    *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
         *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffffb5 | 8;
    poVar2 = std::ostream::_M_insert<long>((long)local_1a8);
    local_1d8._M_dataplus._M_p._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)&local_1d8,1);
    std::__cxx11::stringbuf::str();
    Logger::Log(3,&local_1d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_1d8._M_dataplus._M_p._1_7_,local_1d8._M_dataplus._M_p._0_1_) !=
        &local_1d8.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_1d8._M_dataplus._M_p._1_7_,local_1d8._M_dataplus._M_p._0_1_));
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)&stream);
    std::ios_base::~ios_base(local_138);
    uVar4 = 1;
  }
  operator_delete(__s);
  return uVar4;
}

Assistant:

int ShowOrderNo(std::ostream& os, const AdsDevice& device) const
    {
        uint32_t bytesRead = 0;
        auto readBuffer = std::vector<char>(16);
        const auto status = device.ReadWriteReqEx2(0x0101000D,
                                                   0x0,
                                                   readBuffer.capacity(),
                                                   readBuffer.data(),
                                                   sizeof(licenseId),
                                                   &licenseId,
                                                   &bytesRead);
        if (ADSERR_NOERR != status) {
            LOG_ERROR(__FUNCTION__ << "(): failed with: 0x" << std::hex << status << '\n');
            return 1;
        }

        if (1 < bytesRead) {
            // Ensure the order number is NULL terminated.
            readBuffer.back() = '\0';
            os << readBuffer.data();
        } else {
            os << "N/A";
        }
        return !os.good();
    }